

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O1

void __thiscall cmRST::OutputMarkupLines(cmRST *this,bool inlineMarkup)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> line;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar3 = (this->MarkupLines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->MarkupLines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar1) {
    do {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar2 = (pbVar3->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + pbVar3->_M_string_length);
      if (local_70._M_string_length != 0) {
        std::operator+(&local_50," ",&local_70);
        std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      OutputLine(this,&local_70,inlineMarkup);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
  }
  this->OutputLinePending = true;
  return;
}

Assistant:

void cmRST::OutputMarkupLines(bool inlineMarkup)
{
  for (auto line : this->MarkupLines) {
    if (!line.empty()) {
      line = " " + line;
    }
    this->OutputLine(line, inlineMarkup);
  }
  this->OutputLinePending = true;
}